

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QPointF __thiscall QGraphicsItem::mapFromScene(QGraphicsItem *this,QPointF *point)

{
  QGraphicsItemPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  double in_XMM1_Qa;
  QPointF QVar4;
  QPointF aQStack_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform((this->d_ptr).d);
  if (bVar2) {
    pQVar1 = (this->d_ptr).d;
    dVar3 = point->xp - (pQVar1->sceneTransform).m_matrix[2][0];
    in_XMM1_Qa = point->yp - (pQVar1->sceneTransform).m_matrix[2][1];
  }
  else {
    QTransform::inverted((bool *)aQStack_68);
    dVar3 = (double)QTransform::map(aQStack_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar4.yp = in_XMM1_Qa;
    QVar4.xp = dVar3;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsItem::mapFromScene(const QPointF &point) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return QPointF(point.x() - d_ptr->sceneTransform.dx(), point.y() - d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.inverted().map(point);
}